

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_sse2.c
# Opt level: O0

void aom_minmax_8x8_sse2(uint8_t *s,int p,uint8_t *d,int dp,int *min,int *max)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int in_ECX;
  undefined8 *in_RDX;
  int in_ESI;
  undefined8 *in_RDI;
  uint *in_R8;
  uint *in_R9;
  ushort uVar16;
  ushort uVar17;
  ushort uVar18;
  ushort uVar21;
  ushort uVar22;
  ushort uVar23;
  ushort uVar24;
  ushort uVar25;
  ushort uVar26;
  ushort uVar27;
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  ushort uVar32;
  ushort uVar33;
  ushort uVar34;
  ushort uVar35;
  ushort uVar36;
  ushort uVar37;
  ushort uVar38;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  ushort uVar39;
  ushort uVar40;
  ushort uVar41;
  __m128i u0;
  undefined1 local_9f8;
  undefined1 uStack_9f7;
  undefined1 uStack_9f6;
  undefined1 uStack_9f5;
  undefined1 uStack_9f4;
  undefined1 uStack_9f3;
  undefined1 uStack_9f2;
  undefined1 uStack_9f1;
  undefined1 local_9d8;
  undefined1 uStack_9d7;
  undefined1 uStack_9d6;
  undefined1 uStack_9d5;
  undefined1 uStack_9d4;
  undefined1 uStack_9d3;
  undefined1 uStack_9d2;
  undefined1 uStack_9d1;
  undefined1 local_9b8;
  undefined1 uStack_9b7;
  undefined1 uStack_9b6;
  undefined1 uStack_9b5;
  undefined1 uStack_9b4;
  undefined1 uStack_9b3;
  undefined1 uStack_9b2;
  undefined1 uStack_9b1;
  undefined1 local_998;
  undefined1 uStack_997;
  undefined1 uStack_996;
  undefined1 uStack_995;
  undefined1 uStack_994;
  undefined1 uStack_993;
  undefined1 uStack_992;
  undefined1 uStack_991;
  undefined1 local_978;
  undefined1 uStack_977;
  undefined1 uStack_976;
  undefined1 uStack_975;
  undefined1 uStack_974;
  undefined1 uStack_973;
  undefined1 uStack_972;
  undefined1 uStack_971;
  undefined1 local_958;
  undefined1 uStack_957;
  undefined1 uStack_956;
  undefined1 uStack_955;
  undefined1 uStack_954;
  undefined1 uStack_953;
  undefined1 uStack_952;
  undefined1 uStack_951;
  undefined1 local_938;
  undefined1 uStack_937;
  undefined1 uStack_936;
  undefined1 uStack_935;
  undefined1 uStack_934;
  undefined1 uStack_933;
  undefined1 uStack_932;
  undefined1 uStack_931;
  undefined1 local_918;
  undefined1 uStack_917;
  undefined1 uStack_916;
  undefined1 uStack_915;
  undefined1 uStack_914;
  undefined1 uStack_913;
  undefined1 uStack_912;
  undefined1 uStack_911;
  undefined1 local_8f8;
  undefined1 uStack_8f7;
  undefined1 uStack_8f6;
  undefined1 uStack_8f5;
  undefined1 uStack_8f4;
  undefined1 uStack_8f3;
  undefined1 uStack_8f2;
  undefined1 uStack_8f1;
  undefined1 local_8d8;
  undefined1 uStack_8d7;
  undefined1 uStack_8d6;
  undefined1 uStack_8d5;
  undefined1 uStack_8d4;
  undefined1 uStack_8d3;
  undefined1 uStack_8d2;
  undefined1 uStack_8d1;
  undefined1 local_8b8;
  undefined1 uStack_8b7;
  undefined1 uStack_8b6;
  undefined1 uStack_8b5;
  undefined1 uStack_8b4;
  undefined1 uStack_8b3;
  undefined1 uStack_8b2;
  undefined1 uStack_8b1;
  undefined1 local_898;
  undefined1 uStack_897;
  undefined1 uStack_896;
  undefined1 uStack_895;
  undefined1 uStack_894;
  undefined1 uStack_893;
  undefined1 uStack_892;
  undefined1 uStack_891;
  undefined1 local_878;
  undefined1 uStack_877;
  undefined1 uStack_876;
  undefined1 uStack_875;
  undefined1 uStack_874;
  undefined1 uStack_873;
  undefined1 uStack_872;
  undefined1 uStack_871;
  undefined1 local_858;
  undefined1 uStack_857;
  undefined1 uStack_856;
  undefined1 uStack_855;
  undefined1 uStack_854;
  undefined1 uStack_853;
  undefined1 uStack_852;
  undefined1 uStack_851;
  undefined1 local_838;
  undefined1 uStack_837;
  undefined1 uStack_836;
  undefined1 uStack_835;
  undefined1 uStack_834;
  undefined1 uStack_833;
  undefined1 uStack_832;
  undefined1 uStack_831;
  undefined1 local_818;
  undefined1 uStack_817;
  undefined1 uStack_816;
  undefined1 uStack_815;
  undefined1 uStack_814;
  undefined1 uStack_813;
  undefined1 uStack_812;
  undefined1 uStack_811;
  undefined2 local_388;
  undefined2 uStack_386;
  undefined2 uStack_384;
  undefined2 uStack_382;
  undefined2 uStack_380;
  undefined2 uStack_37e;
  undefined2 uStack_37c;
  undefined2 uStack_37a;
  undefined2 local_378;
  undefined2 uStack_376;
  undefined2 uStack_374;
  undefined2 uStack_372;
  undefined2 uStack_370;
  undefined2 uStack_36e;
  undefined2 uStack_36c;
  undefined2 uStack_36a;
  undefined2 local_348;
  undefined2 uStack_346;
  undefined2 uStack_344;
  undefined2 uStack_342;
  undefined2 uStack_340;
  undefined2 uStack_33e;
  undefined2 uStack_33c;
  undefined2 uStack_33a;
  undefined2 local_338;
  undefined2 uStack_336;
  undefined2 uStack_334;
  undefined2 uStack_332;
  undefined2 uStack_330;
  undefined2 uStack_32e;
  undefined2 uStack_32c;
  undefined2 uStack_32a;
  undefined2 local_308;
  undefined2 uStack_306;
  undefined2 uStack_304;
  undefined2 uStack_302;
  undefined2 uStack_300;
  undefined2 uStack_2fe;
  undefined2 uStack_2fc;
  undefined2 uStack_2fa;
  undefined2 local_2f8;
  undefined2 uStack_2f6;
  undefined2 uStack_2f4;
  undefined2 uStack_2f2;
  undefined2 uStack_2f0;
  undefined2 uStack_2ee;
  undefined2 uStack_2ec;
  undefined2 uStack_2ea;
  undefined2 local_2c8;
  undefined2 uStack_2c6;
  undefined2 uStack_2c4;
  undefined2 uStack_2c2;
  undefined2 uStack_2c0;
  undefined2 uStack_2be;
  undefined2 uStack_2bc;
  undefined2 uStack_2ba;
  undefined2 local_2b8;
  undefined2 uStack_2b6;
  undefined2 uStack_2b4;
  undefined2 uStack_2b2;
  undefined2 uStack_2b0;
  undefined2 uStack_2ae;
  undefined2 uStack_2ac;
  undefined2 uStack_2aa;
  undefined2 local_288;
  undefined2 uStack_286;
  undefined2 uStack_284;
  undefined2 uStack_282;
  undefined2 uStack_280;
  undefined2 uStack_27e;
  undefined2 uStack_27c;
  undefined2 uStack_27a;
  undefined2 local_278;
  undefined2 uStack_276;
  undefined2 uStack_274;
  undefined2 uStack_272;
  undefined2 uStack_270;
  undefined2 uStack_26e;
  undefined2 uStack_26c;
  undefined2 uStack_26a;
  undefined2 local_248;
  undefined2 uStack_246;
  undefined2 uStack_244;
  undefined2 uStack_242;
  undefined2 uStack_240;
  undefined2 uStack_23e;
  undefined2 uStack_23c;
  undefined2 uStack_23a;
  undefined2 local_238;
  undefined2 uStack_236;
  undefined2 uStack_234;
  undefined2 uStack_232;
  undefined2 uStack_230;
  undefined2 uStack_22e;
  undefined2 uStack_22c;
  undefined2 uStack_22a;
  undefined2 local_208;
  undefined2 uStack_206;
  undefined2 uStack_204;
  undefined2 uStack_202;
  undefined2 uStack_200;
  undefined2 uStack_1fe;
  undefined2 uStack_1fc;
  undefined2 uStack_1fa;
  undefined2 local_1f8;
  undefined2 uStack_1f6;
  undefined2 uStack_1f4;
  undefined2 uStack_1f2;
  undefined2 uStack_1f0;
  undefined2 uStack_1ee;
  undefined2 uStack_1ec;
  undefined2 uStack_1ea;
  undefined2 local_1e8;
  undefined2 uStack_1e6;
  undefined2 uStack_1e4;
  undefined2 uStack_1e2;
  undefined2 uStack_1e0;
  undefined2 uStack_1de;
  undefined2 uStack_1dc;
  undefined2 uStack_1da;
  undefined2 local_1d8;
  undefined2 uStack_1d6;
  undefined2 uStack_1d4;
  undefined2 uStack_1d2;
  undefined2 uStack_1d0;
  undefined2 uStack_1ce;
  undefined2 uStack_1cc;
  undefined2 uStack_1ca;
  __m128i absdiff;
  __m128i absdiff0;
  __m128i negdiff;
  __m128i minabsdiff;
  __m128i maxabsdiff;
  __m128i diff;
  __m128i d0;
  __m128i s0;
  
  uVar1 = *in_RDI;
  local_818 = (byte)uVar1;
  uStack_817 = (undefined1)((ulong)uVar1 >> 8);
  uStack_816 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_815 = (undefined1)((ulong)uVar1 >> 0x18);
  uStack_814 = (byte)((ulong)uVar1 >> 0x20);
  uStack_813 = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_812 = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_811 = (undefined1)((ulong)uVar1 >> 0x38);
  uVar1 = *in_RDX;
  local_838 = (byte)uVar1;
  uStack_837 = (undefined1)((ulong)uVar1 >> 8);
  uStack_836 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_835 = (undefined1)((ulong)uVar1 >> 0x18);
  uStack_834 = (byte)((ulong)uVar1 >> 0x20);
  uStack_833 = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_832 = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_831 = (undefined1)((ulong)uVar1 >> 0x38);
  auVar15[1] = 0;
  auVar15[0] = local_818;
  auVar15[2] = uStack_817;
  auVar15[3] = 0;
  auVar15[4] = uStack_816;
  auVar15[5] = 0;
  auVar15[6] = uStack_815;
  auVar15[7] = 0;
  auVar15[9] = 0;
  auVar15[8] = uStack_814;
  auVar15[10] = uStack_813;
  auVar15[0xb] = 0;
  auVar15[0xc] = uStack_812;
  auVar15[0xd] = 0;
  auVar15[0xe] = uStack_811;
  auVar14[1] = 0;
  auVar14[0] = local_838;
  auVar14[2] = uStack_837;
  auVar14[3] = 0;
  auVar14[4] = uStack_836;
  auVar14[5] = 0;
  auVar14[6] = uStack_835;
  auVar14[7] = 0;
  auVar14[9] = 0;
  auVar14[8] = uStack_834;
  auVar14[10] = uStack_833;
  auVar14[0xb] = 0;
  auVar14[0xc] = uStack_832;
  auVar14[0xd] = 0;
  auVar14[0xe] = uStack_831;
  auVar15[0xf] = 0;
  auVar14[0xf] = 0;
  auVar19 = psubsw(auVar15,auVar14);
  auVar20 = psubsw(ZEXT816(0),auVar19);
  local_1d8 = auVar19._0_2_;
  uStack_1d6 = auVar19._2_2_;
  uStack_1d4 = auVar19._4_2_;
  uStack_1d2 = auVar19._6_2_;
  uStack_1d0 = auVar19._8_2_;
  uStack_1ce = auVar19._10_2_;
  uStack_1cc = auVar19._12_2_;
  uStack_1ca = auVar19._14_2_;
  local_1e8 = auVar20._0_2_;
  uStack_1e6 = auVar20._2_2_;
  uStack_1e4 = auVar20._4_2_;
  uStack_1e2 = auVar20._6_2_;
  uStack_1e0 = auVar20._8_2_;
  uStack_1de = auVar20._10_2_;
  uStack_1dc = auVar20._12_2_;
  uStack_1da = auVar20._14_2_;
  uVar16 = (ushort)(local_1d8 < local_1e8) * local_1e8 |
           (ushort)(local_1d8 >= local_1e8) * local_1d8;
  uVar21 = (ushort)(uStack_1d6 < uStack_1e6) * uStack_1e6 |
           (ushort)(uStack_1d6 >= uStack_1e6) * uStack_1d6;
  uVar24 = (ushort)(uStack_1d4 < uStack_1e4) * uStack_1e4 |
           (ushort)(uStack_1d4 >= uStack_1e4) * uStack_1d4;
  uVar27 = (ushort)(uStack_1d2 < uStack_1e2) * uStack_1e2 |
           (ushort)(uStack_1d2 >= uStack_1e2) * uStack_1d2;
  uVar30 = (ushort)(uStack_1d0 < uStack_1e0) * uStack_1e0 |
           (ushort)(uStack_1d0 >= uStack_1e0) * uStack_1d0;
  uVar33 = (ushort)(uStack_1ce < uStack_1de) * uStack_1de |
           (ushort)(uStack_1ce >= uStack_1de) * uStack_1ce;
  uVar36 = (ushort)(uStack_1cc < uStack_1dc) * uStack_1dc |
           (ushort)(uStack_1cc >= uStack_1dc) * uStack_1cc;
  uVar39 = (ushort)(uStack_1ca < uStack_1da) * uStack_1da |
           (ushort)(uStack_1ca >= uStack_1da) * uStack_1ca;
  uVar1 = *(undefined8 *)((long)in_RDI + (long)in_ESI);
  local_858 = (byte)uVar1;
  uStack_857 = (undefined1)((ulong)uVar1 >> 8);
  uStack_856 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_855 = (undefined1)((ulong)uVar1 >> 0x18);
  uStack_854 = (byte)((ulong)uVar1 >> 0x20);
  uStack_853 = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_852 = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_851 = (undefined1)((ulong)uVar1 >> 0x38);
  uVar1 = *(undefined8 *)((long)in_RDX + (long)in_ECX);
  local_878 = (byte)uVar1;
  uStack_877 = (undefined1)((ulong)uVar1 >> 8);
  uStack_876 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_875 = (undefined1)((ulong)uVar1 >> 0x18);
  uStack_874 = (byte)((ulong)uVar1 >> 0x20);
  uStack_873 = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_872 = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_871 = (undefined1)((ulong)uVar1 >> 0x38);
  auVar13[1] = 0;
  auVar13[0] = local_858;
  auVar13[2] = uStack_857;
  auVar13[3] = 0;
  auVar13[4] = uStack_856;
  auVar13[5] = 0;
  auVar13[6] = uStack_855;
  auVar13[7] = 0;
  auVar13[9] = 0;
  auVar13[8] = uStack_854;
  auVar13[10] = uStack_853;
  auVar13[0xb] = 0;
  auVar13[0xc] = uStack_852;
  auVar13[0xd] = 0;
  auVar13[0xe] = uStack_851;
  auVar12[1] = 0;
  auVar12[0] = local_878;
  auVar12[2] = uStack_877;
  auVar12[3] = 0;
  auVar12[4] = uStack_876;
  auVar12[5] = 0;
  auVar12[6] = uStack_875;
  auVar12[7] = 0;
  auVar12[9] = 0;
  auVar12[8] = uStack_874;
  auVar12[10] = uStack_873;
  auVar12[0xb] = 0;
  auVar12[0xc] = uStack_872;
  auVar12[0xd] = 0;
  auVar12[0xe] = uStack_871;
  auVar13[0xf] = 0;
  auVar12[0xf] = 0;
  auVar19 = psubsw(auVar13,auVar12);
  auVar20 = psubsw(ZEXT816(0),auVar19);
  local_1f8 = auVar19._0_2_;
  uStack_1f6 = auVar19._2_2_;
  uStack_1f4 = auVar19._4_2_;
  uStack_1f2 = auVar19._6_2_;
  uStack_1f0 = auVar19._8_2_;
  uStack_1ee = auVar19._10_2_;
  uStack_1ec = auVar19._12_2_;
  uStack_1ea = auVar19._14_2_;
  local_208 = auVar20._0_2_;
  uStack_206 = auVar20._2_2_;
  uStack_204 = auVar20._4_2_;
  uStack_202 = auVar20._6_2_;
  uStack_200 = auVar20._8_2_;
  uStack_1fe = auVar20._10_2_;
  uStack_1fc = auVar20._12_2_;
  uStack_1fa = auVar20._14_2_;
  uVar17 = (ushort)(local_1f8 < local_208) * local_208 |
           (ushort)(local_1f8 >= local_208) * local_1f8;
  uVar22 = (ushort)(uStack_1f6 < uStack_206) * uStack_206 |
           (ushort)(uStack_1f6 >= uStack_206) * uStack_1f6;
  uVar25 = (ushort)(uStack_1f4 < uStack_204) * uStack_204 |
           (ushort)(uStack_1f4 >= uStack_204) * uStack_1f4;
  uVar28 = (ushort)(uStack_1f2 < uStack_202) * uStack_202 |
           (ushort)(uStack_1f2 >= uStack_202) * uStack_1f2;
  uVar31 = (ushort)(uStack_1f0 < uStack_200) * uStack_200 |
           (ushort)(uStack_1f0 >= uStack_200) * uStack_1f0;
  uVar34 = (ushort)(uStack_1ee < uStack_1fe) * uStack_1fe |
           (ushort)(uStack_1ee >= uStack_1fe) * uStack_1ee;
  uVar37 = (ushort)(uStack_1ec < uStack_1fc) * uStack_1fc |
           (ushort)(uStack_1ec >= uStack_1fc) * uStack_1ec;
  uVar40 = (ushort)(uStack_1ea < uStack_1fa) * uStack_1fa |
           (ushort)(uStack_1ea >= uStack_1fa) * uStack_1ea;
  uVar18 = ((short)uVar16 < (short)uVar17) * uVar17 | ((short)uVar16 >= (short)uVar17) * uVar16;
  uVar23 = ((short)uVar21 < (short)uVar22) * uVar22 | ((short)uVar21 >= (short)uVar22) * uVar21;
  uVar26 = ((short)uVar24 < (short)uVar25) * uVar25 | ((short)uVar24 >= (short)uVar25) * uVar24;
  uVar29 = ((short)uVar27 < (short)uVar28) * uVar28 | ((short)uVar27 >= (short)uVar28) * uVar27;
  uVar32 = ((short)uVar30 < (short)uVar31) * uVar31 | ((short)uVar30 >= (short)uVar31) * uVar30;
  uVar35 = ((short)uVar33 < (short)uVar34) * uVar34 | ((short)uVar33 >= (short)uVar34) * uVar33;
  uVar38 = ((short)uVar36 < (short)uVar37) * uVar37 | ((short)uVar36 >= (short)uVar37) * uVar36;
  uVar41 = ((short)uVar39 < (short)uVar40) * uVar40 | ((short)uVar39 >= (short)uVar40) * uVar39;
  uVar16 = ((short)uVar17 < (short)uVar16) * uVar17 | ((short)uVar17 >= (short)uVar16) * uVar16;
  uVar21 = ((short)uVar22 < (short)uVar21) * uVar22 | ((short)uVar22 >= (short)uVar21) * uVar21;
  uVar24 = ((short)uVar25 < (short)uVar24) * uVar25 | ((short)uVar25 >= (short)uVar24) * uVar24;
  uVar27 = ((short)uVar28 < (short)uVar27) * uVar28 | ((short)uVar28 >= (short)uVar27) * uVar27;
  uVar30 = ((short)uVar31 < (short)uVar30) * uVar31 | ((short)uVar31 >= (short)uVar30) * uVar30;
  uVar33 = ((short)uVar34 < (short)uVar33) * uVar34 | ((short)uVar34 >= (short)uVar33) * uVar33;
  uVar36 = ((short)uVar37 < (short)uVar36) * uVar37 | ((short)uVar37 >= (short)uVar36) * uVar36;
  uVar39 = ((short)uVar40 < (short)uVar39) * uVar40 | ((short)uVar40 >= (short)uVar39) * uVar39;
  uVar1 = *(undefined8 *)((long)in_RDI + (long)(in_ESI * 2));
  local_898 = (byte)uVar1;
  uStack_897 = (undefined1)((ulong)uVar1 >> 8);
  uStack_896 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_895 = (undefined1)((ulong)uVar1 >> 0x18);
  uStack_894 = (byte)((ulong)uVar1 >> 0x20);
  uStack_893 = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_892 = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_891 = (undefined1)((ulong)uVar1 >> 0x38);
  uVar1 = *(undefined8 *)((long)in_RDX + (long)(in_ECX * 2));
  local_8b8 = (byte)uVar1;
  uStack_8b7 = (undefined1)((ulong)uVar1 >> 8);
  uStack_8b6 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_8b5 = (undefined1)((ulong)uVar1 >> 0x18);
  uStack_8b4 = (byte)((ulong)uVar1 >> 0x20);
  uStack_8b3 = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_8b2 = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_8b1 = (undefined1)((ulong)uVar1 >> 0x38);
  auVar11[1] = 0;
  auVar11[0] = local_898;
  auVar11[2] = uStack_897;
  auVar11[3] = 0;
  auVar11[4] = uStack_896;
  auVar11[5] = 0;
  auVar11[6] = uStack_895;
  auVar11[7] = 0;
  auVar11[9] = 0;
  auVar11[8] = uStack_894;
  auVar11[10] = uStack_893;
  auVar11[0xb] = 0;
  auVar11[0xc] = uStack_892;
  auVar11[0xd] = 0;
  auVar11[0xe] = uStack_891;
  auVar10[1] = 0;
  auVar10[0] = local_8b8;
  auVar10[2] = uStack_8b7;
  auVar10[3] = 0;
  auVar10[4] = uStack_8b6;
  auVar10[5] = 0;
  auVar10[6] = uStack_8b5;
  auVar10[7] = 0;
  auVar10[9] = 0;
  auVar10[8] = uStack_8b4;
  auVar10[10] = uStack_8b3;
  auVar10[0xb] = 0;
  auVar10[0xc] = uStack_8b2;
  auVar10[0xd] = 0;
  auVar10[0xe] = uStack_8b1;
  auVar11[0xf] = 0;
  auVar10[0xf] = 0;
  auVar19 = psubsw(auVar11,auVar10);
  auVar20 = psubsw(ZEXT816(0),auVar19);
  local_238 = auVar19._0_2_;
  uStack_236 = auVar19._2_2_;
  uStack_234 = auVar19._4_2_;
  uStack_232 = auVar19._6_2_;
  uStack_230 = auVar19._8_2_;
  uStack_22e = auVar19._10_2_;
  uStack_22c = auVar19._12_2_;
  uStack_22a = auVar19._14_2_;
  local_248 = auVar20._0_2_;
  uStack_246 = auVar20._2_2_;
  uStack_244 = auVar20._4_2_;
  uStack_242 = auVar20._6_2_;
  uStack_240 = auVar20._8_2_;
  uStack_23e = auVar20._10_2_;
  uStack_23c = auVar20._12_2_;
  uStack_23a = auVar20._14_2_;
  uVar17 = (ushort)(local_238 < local_248) * local_248 |
           (ushort)(local_238 >= local_248) * local_238;
  uVar22 = (ushort)(uStack_236 < uStack_246) * uStack_246 |
           (ushort)(uStack_236 >= uStack_246) * uStack_236;
  uVar25 = (ushort)(uStack_234 < uStack_244) * uStack_244 |
           (ushort)(uStack_234 >= uStack_244) * uStack_234;
  uVar28 = (ushort)(uStack_232 < uStack_242) * uStack_242 |
           (ushort)(uStack_232 >= uStack_242) * uStack_232;
  uVar31 = (ushort)(uStack_230 < uStack_240) * uStack_240 |
           (ushort)(uStack_230 >= uStack_240) * uStack_230;
  uVar34 = (ushort)(uStack_22e < uStack_23e) * uStack_23e |
           (ushort)(uStack_22e >= uStack_23e) * uStack_22e;
  uVar37 = (ushort)(uStack_22c < uStack_23c) * uStack_23c |
           (ushort)(uStack_22c >= uStack_23c) * uStack_22c;
  uVar40 = (ushort)(uStack_22a < uStack_23a) * uStack_23a |
           (ushort)(uStack_22a >= uStack_23a) * uStack_22a;
  uVar18 = ((short)uVar18 < (short)uVar17) * uVar17 | ((short)uVar18 >= (short)uVar17) * uVar18;
  uVar23 = ((short)uVar23 < (short)uVar22) * uVar22 | ((short)uVar23 >= (short)uVar22) * uVar23;
  uVar26 = ((short)uVar26 < (short)uVar25) * uVar25 | ((short)uVar26 >= (short)uVar25) * uVar26;
  uVar29 = ((short)uVar29 < (short)uVar28) * uVar28 | ((short)uVar29 >= (short)uVar28) * uVar29;
  uVar32 = ((short)uVar32 < (short)uVar31) * uVar31 | ((short)uVar32 >= (short)uVar31) * uVar32;
  uVar35 = ((short)uVar35 < (short)uVar34) * uVar34 | ((short)uVar35 >= (short)uVar34) * uVar35;
  uVar38 = ((short)uVar38 < (short)uVar37) * uVar37 | ((short)uVar38 >= (short)uVar37) * uVar38;
  uVar41 = ((short)uVar41 < (short)uVar40) * uVar40 | ((short)uVar41 >= (short)uVar40) * uVar41;
  uVar16 = ((short)uVar17 < (short)uVar16) * uVar17 | ((short)uVar17 >= (short)uVar16) * uVar16;
  uVar21 = ((short)uVar22 < (short)uVar21) * uVar22 | ((short)uVar22 >= (short)uVar21) * uVar21;
  uVar24 = ((short)uVar25 < (short)uVar24) * uVar25 | ((short)uVar25 >= (short)uVar24) * uVar24;
  uVar27 = ((short)uVar28 < (short)uVar27) * uVar28 | ((short)uVar28 >= (short)uVar27) * uVar27;
  uVar30 = ((short)uVar31 < (short)uVar30) * uVar31 | ((short)uVar31 >= (short)uVar30) * uVar30;
  uVar33 = ((short)uVar34 < (short)uVar33) * uVar34 | ((short)uVar34 >= (short)uVar33) * uVar33;
  uVar36 = ((short)uVar37 < (short)uVar36) * uVar37 | ((short)uVar37 >= (short)uVar36) * uVar36;
  uVar39 = ((short)uVar40 < (short)uVar39) * uVar40 | ((short)uVar40 >= (short)uVar39) * uVar39;
  uVar1 = *(undefined8 *)((long)in_RDI + (long)(in_ESI * 3));
  local_8d8 = (byte)uVar1;
  uStack_8d7 = (undefined1)((ulong)uVar1 >> 8);
  uStack_8d6 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_8d5 = (undefined1)((ulong)uVar1 >> 0x18);
  uStack_8d4 = (byte)((ulong)uVar1 >> 0x20);
  uStack_8d3 = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_8d2 = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_8d1 = (undefined1)((ulong)uVar1 >> 0x38);
  uVar1 = *(undefined8 *)((long)in_RDX + (long)(in_ECX * 3));
  local_8f8 = (byte)uVar1;
  uStack_8f7 = (undefined1)((ulong)uVar1 >> 8);
  uStack_8f6 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_8f5 = (undefined1)((ulong)uVar1 >> 0x18);
  uStack_8f4 = (byte)((ulong)uVar1 >> 0x20);
  uStack_8f3 = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_8f2 = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_8f1 = (undefined1)((ulong)uVar1 >> 0x38);
  auVar9[1] = 0;
  auVar9[0] = local_8d8;
  auVar9[2] = uStack_8d7;
  auVar9[3] = 0;
  auVar9[4] = uStack_8d6;
  auVar9[5] = 0;
  auVar9[6] = uStack_8d5;
  auVar9[7] = 0;
  auVar9[9] = 0;
  auVar9[8] = uStack_8d4;
  auVar9[10] = uStack_8d3;
  auVar9[0xb] = 0;
  auVar9[0xc] = uStack_8d2;
  auVar9[0xd] = 0;
  auVar9[0xe] = uStack_8d1;
  auVar8[1] = 0;
  auVar8[0] = local_8f8;
  auVar8[2] = uStack_8f7;
  auVar8[3] = 0;
  auVar8[4] = uStack_8f6;
  auVar8[5] = 0;
  auVar8[6] = uStack_8f5;
  auVar8[7] = 0;
  auVar8[9] = 0;
  auVar8[8] = uStack_8f4;
  auVar8[10] = uStack_8f3;
  auVar8[0xb] = 0;
  auVar8[0xc] = uStack_8f2;
  auVar8[0xd] = 0;
  auVar8[0xe] = uStack_8f1;
  auVar9[0xf] = 0;
  auVar8[0xf] = 0;
  auVar19 = psubsw(auVar9,auVar8);
  auVar20 = psubsw(ZEXT816(0),auVar19);
  local_278 = auVar19._0_2_;
  uStack_276 = auVar19._2_2_;
  uStack_274 = auVar19._4_2_;
  uStack_272 = auVar19._6_2_;
  uStack_270 = auVar19._8_2_;
  uStack_26e = auVar19._10_2_;
  uStack_26c = auVar19._12_2_;
  uStack_26a = auVar19._14_2_;
  local_288 = auVar20._0_2_;
  uStack_286 = auVar20._2_2_;
  uStack_284 = auVar20._4_2_;
  uStack_282 = auVar20._6_2_;
  uStack_280 = auVar20._8_2_;
  uStack_27e = auVar20._10_2_;
  uStack_27c = auVar20._12_2_;
  uStack_27a = auVar20._14_2_;
  uVar17 = (ushort)(local_278 < local_288) * local_288 |
           (ushort)(local_278 >= local_288) * local_278;
  uVar22 = (ushort)(uStack_276 < uStack_286) * uStack_286 |
           (ushort)(uStack_276 >= uStack_286) * uStack_276;
  uVar25 = (ushort)(uStack_274 < uStack_284) * uStack_284 |
           (ushort)(uStack_274 >= uStack_284) * uStack_274;
  uVar28 = (ushort)(uStack_272 < uStack_282) * uStack_282 |
           (ushort)(uStack_272 >= uStack_282) * uStack_272;
  uVar31 = (ushort)(uStack_270 < uStack_280) * uStack_280 |
           (ushort)(uStack_270 >= uStack_280) * uStack_270;
  uVar34 = (ushort)(uStack_26e < uStack_27e) * uStack_27e |
           (ushort)(uStack_26e >= uStack_27e) * uStack_26e;
  uVar37 = (ushort)(uStack_26c < uStack_27c) * uStack_27c |
           (ushort)(uStack_26c >= uStack_27c) * uStack_26c;
  uVar40 = (ushort)(uStack_26a < uStack_27a) * uStack_27a |
           (ushort)(uStack_26a >= uStack_27a) * uStack_26a;
  uVar18 = ((short)uVar18 < (short)uVar17) * uVar17 | ((short)uVar18 >= (short)uVar17) * uVar18;
  uVar23 = ((short)uVar23 < (short)uVar22) * uVar22 | ((short)uVar23 >= (short)uVar22) * uVar23;
  uVar26 = ((short)uVar26 < (short)uVar25) * uVar25 | ((short)uVar26 >= (short)uVar25) * uVar26;
  uVar29 = ((short)uVar29 < (short)uVar28) * uVar28 | ((short)uVar29 >= (short)uVar28) * uVar29;
  uVar32 = ((short)uVar32 < (short)uVar31) * uVar31 | ((short)uVar32 >= (short)uVar31) * uVar32;
  uVar35 = ((short)uVar35 < (short)uVar34) * uVar34 | ((short)uVar35 >= (short)uVar34) * uVar35;
  uVar38 = ((short)uVar38 < (short)uVar37) * uVar37 | ((short)uVar38 >= (short)uVar37) * uVar38;
  uVar41 = ((short)uVar41 < (short)uVar40) * uVar40 | ((short)uVar41 >= (short)uVar40) * uVar41;
  uVar16 = ((short)uVar17 < (short)uVar16) * uVar17 | ((short)uVar17 >= (short)uVar16) * uVar16;
  uVar21 = ((short)uVar22 < (short)uVar21) * uVar22 | ((short)uVar22 >= (short)uVar21) * uVar21;
  uVar24 = ((short)uVar25 < (short)uVar24) * uVar25 | ((short)uVar25 >= (short)uVar24) * uVar24;
  uVar27 = ((short)uVar28 < (short)uVar27) * uVar28 | ((short)uVar28 >= (short)uVar27) * uVar27;
  uVar30 = ((short)uVar31 < (short)uVar30) * uVar31 | ((short)uVar31 >= (short)uVar30) * uVar30;
  uVar33 = ((short)uVar34 < (short)uVar33) * uVar34 | ((short)uVar34 >= (short)uVar33) * uVar33;
  uVar36 = ((short)uVar37 < (short)uVar36) * uVar37 | ((short)uVar37 >= (short)uVar36) * uVar36;
  uVar39 = ((short)uVar40 < (short)uVar39) * uVar40 | ((short)uVar40 >= (short)uVar39) * uVar39;
  uVar1 = *(undefined8 *)((long)in_RDI + (long)(in_ESI << 2));
  local_918 = (byte)uVar1;
  uStack_917 = (undefined1)((ulong)uVar1 >> 8);
  uStack_916 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_915 = (undefined1)((ulong)uVar1 >> 0x18);
  uStack_914 = (byte)((ulong)uVar1 >> 0x20);
  uStack_913 = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_912 = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_911 = (undefined1)((ulong)uVar1 >> 0x38);
  uVar1 = *(undefined8 *)((long)in_RDX + (long)(in_ECX << 2));
  local_938 = (byte)uVar1;
  uStack_937 = (undefined1)((ulong)uVar1 >> 8);
  uStack_936 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_935 = (undefined1)((ulong)uVar1 >> 0x18);
  uStack_934 = (byte)((ulong)uVar1 >> 0x20);
  uStack_933 = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_932 = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_931 = (undefined1)((ulong)uVar1 >> 0x38);
  auVar7[1] = 0;
  auVar7[0] = local_918;
  auVar7[2] = uStack_917;
  auVar7[3] = 0;
  auVar7[4] = uStack_916;
  auVar7[5] = 0;
  auVar7[6] = uStack_915;
  auVar7[7] = 0;
  auVar7[9] = 0;
  auVar7[8] = uStack_914;
  auVar7[10] = uStack_913;
  auVar7[0xb] = 0;
  auVar7[0xc] = uStack_912;
  auVar7[0xd] = 0;
  auVar7[0xe] = uStack_911;
  auVar6[1] = 0;
  auVar6[0] = local_938;
  auVar6[2] = uStack_937;
  auVar6[3] = 0;
  auVar6[4] = uStack_936;
  auVar6[5] = 0;
  auVar6[6] = uStack_935;
  auVar6[7] = 0;
  auVar6[9] = 0;
  auVar6[8] = uStack_934;
  auVar6[10] = uStack_933;
  auVar6[0xb] = 0;
  auVar6[0xc] = uStack_932;
  auVar6[0xd] = 0;
  auVar6[0xe] = uStack_931;
  auVar7[0xf] = 0;
  auVar6[0xf] = 0;
  auVar19 = psubsw(auVar7,auVar6);
  auVar20 = psubsw(ZEXT816(0),auVar19);
  local_2b8 = auVar19._0_2_;
  uStack_2b6 = auVar19._2_2_;
  uStack_2b4 = auVar19._4_2_;
  uStack_2b2 = auVar19._6_2_;
  uStack_2b0 = auVar19._8_2_;
  uStack_2ae = auVar19._10_2_;
  uStack_2ac = auVar19._12_2_;
  uStack_2aa = auVar19._14_2_;
  local_2c8 = auVar20._0_2_;
  uStack_2c6 = auVar20._2_2_;
  uStack_2c4 = auVar20._4_2_;
  uStack_2c2 = auVar20._6_2_;
  uStack_2c0 = auVar20._8_2_;
  uStack_2be = auVar20._10_2_;
  uStack_2bc = auVar20._12_2_;
  uStack_2ba = auVar20._14_2_;
  uVar17 = (ushort)(local_2b8 < local_2c8) * local_2c8 |
           (ushort)(local_2b8 >= local_2c8) * local_2b8;
  uVar22 = (ushort)(uStack_2b6 < uStack_2c6) * uStack_2c6 |
           (ushort)(uStack_2b6 >= uStack_2c6) * uStack_2b6;
  uVar25 = (ushort)(uStack_2b4 < uStack_2c4) * uStack_2c4 |
           (ushort)(uStack_2b4 >= uStack_2c4) * uStack_2b4;
  uVar28 = (ushort)(uStack_2b2 < uStack_2c2) * uStack_2c2 |
           (ushort)(uStack_2b2 >= uStack_2c2) * uStack_2b2;
  uVar31 = (ushort)(uStack_2b0 < uStack_2c0) * uStack_2c0 |
           (ushort)(uStack_2b0 >= uStack_2c0) * uStack_2b0;
  uVar34 = (ushort)(uStack_2ae < uStack_2be) * uStack_2be |
           (ushort)(uStack_2ae >= uStack_2be) * uStack_2ae;
  uVar37 = (ushort)(uStack_2ac < uStack_2bc) * uStack_2bc |
           (ushort)(uStack_2ac >= uStack_2bc) * uStack_2ac;
  uVar40 = (ushort)(uStack_2aa < uStack_2ba) * uStack_2ba |
           (ushort)(uStack_2aa >= uStack_2ba) * uStack_2aa;
  uVar18 = ((short)uVar18 < (short)uVar17) * uVar17 | ((short)uVar18 >= (short)uVar17) * uVar18;
  uVar23 = ((short)uVar23 < (short)uVar22) * uVar22 | ((short)uVar23 >= (short)uVar22) * uVar23;
  uVar26 = ((short)uVar26 < (short)uVar25) * uVar25 | ((short)uVar26 >= (short)uVar25) * uVar26;
  uVar29 = ((short)uVar29 < (short)uVar28) * uVar28 | ((short)uVar29 >= (short)uVar28) * uVar29;
  uVar32 = ((short)uVar32 < (short)uVar31) * uVar31 | ((short)uVar32 >= (short)uVar31) * uVar32;
  uVar35 = ((short)uVar35 < (short)uVar34) * uVar34 | ((short)uVar35 >= (short)uVar34) * uVar35;
  uVar38 = ((short)uVar38 < (short)uVar37) * uVar37 | ((short)uVar38 >= (short)uVar37) * uVar38;
  uVar41 = ((short)uVar41 < (short)uVar40) * uVar40 | ((short)uVar41 >= (short)uVar40) * uVar41;
  uVar16 = ((short)uVar17 < (short)uVar16) * uVar17 | ((short)uVar17 >= (short)uVar16) * uVar16;
  uVar21 = ((short)uVar22 < (short)uVar21) * uVar22 | ((short)uVar22 >= (short)uVar21) * uVar21;
  uVar24 = ((short)uVar25 < (short)uVar24) * uVar25 | ((short)uVar25 >= (short)uVar24) * uVar24;
  uVar27 = ((short)uVar28 < (short)uVar27) * uVar28 | ((short)uVar28 >= (short)uVar27) * uVar27;
  uVar30 = ((short)uVar31 < (short)uVar30) * uVar31 | ((short)uVar31 >= (short)uVar30) * uVar30;
  uVar33 = ((short)uVar34 < (short)uVar33) * uVar34 | ((short)uVar34 >= (short)uVar33) * uVar33;
  uVar36 = ((short)uVar37 < (short)uVar36) * uVar37 | ((short)uVar37 >= (short)uVar36) * uVar36;
  uVar39 = ((short)uVar40 < (short)uVar39) * uVar40 | ((short)uVar40 >= (short)uVar39) * uVar39;
  uVar1 = *(undefined8 *)((long)in_RDI + (long)(in_ESI * 5));
  local_958 = (byte)uVar1;
  uStack_957 = (undefined1)((ulong)uVar1 >> 8);
  uStack_956 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_955 = (undefined1)((ulong)uVar1 >> 0x18);
  uStack_954 = (byte)((ulong)uVar1 >> 0x20);
  uStack_953 = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_952 = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_951 = (undefined1)((ulong)uVar1 >> 0x38);
  uVar1 = *(undefined8 *)((long)in_RDX + (long)(in_ECX * 5));
  local_978 = (byte)uVar1;
  uStack_977 = (undefined1)((ulong)uVar1 >> 8);
  uStack_976 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_975 = (undefined1)((ulong)uVar1 >> 0x18);
  uStack_974 = (byte)((ulong)uVar1 >> 0x20);
  uStack_973 = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_972 = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_971 = (undefined1)((ulong)uVar1 >> 0x38);
  auVar5[1] = 0;
  auVar5[0] = local_958;
  auVar5[2] = uStack_957;
  auVar5[3] = 0;
  auVar5[4] = uStack_956;
  auVar5[5] = 0;
  auVar5[6] = uStack_955;
  auVar5[7] = 0;
  auVar5[9] = 0;
  auVar5[8] = uStack_954;
  auVar5[10] = uStack_953;
  auVar5[0xb] = 0;
  auVar5[0xc] = uStack_952;
  auVar5[0xd] = 0;
  auVar5[0xe] = uStack_951;
  auVar4[1] = 0;
  auVar4[0] = local_978;
  auVar4[2] = uStack_977;
  auVar4[3] = 0;
  auVar4[4] = uStack_976;
  auVar4[5] = 0;
  auVar4[6] = uStack_975;
  auVar4[7] = 0;
  auVar4[9] = 0;
  auVar4[8] = uStack_974;
  auVar4[10] = uStack_973;
  auVar4[0xb] = 0;
  auVar4[0xc] = uStack_972;
  auVar4[0xd] = 0;
  auVar4[0xe] = uStack_971;
  auVar5[0xf] = 0;
  auVar4[0xf] = 0;
  auVar19 = psubsw(auVar5,auVar4);
  auVar20 = psubsw(ZEXT816(0),auVar19);
  local_2f8 = auVar19._0_2_;
  uStack_2f6 = auVar19._2_2_;
  uStack_2f4 = auVar19._4_2_;
  uStack_2f2 = auVar19._6_2_;
  uStack_2f0 = auVar19._8_2_;
  uStack_2ee = auVar19._10_2_;
  uStack_2ec = auVar19._12_2_;
  uStack_2ea = auVar19._14_2_;
  local_308 = auVar20._0_2_;
  uStack_306 = auVar20._2_2_;
  uStack_304 = auVar20._4_2_;
  uStack_302 = auVar20._6_2_;
  uStack_300 = auVar20._8_2_;
  uStack_2fe = auVar20._10_2_;
  uStack_2fc = auVar20._12_2_;
  uStack_2fa = auVar20._14_2_;
  uVar17 = (ushort)(local_2f8 < local_308) * local_308 |
           (ushort)(local_2f8 >= local_308) * local_2f8;
  uVar22 = (ushort)(uStack_2f6 < uStack_306) * uStack_306 |
           (ushort)(uStack_2f6 >= uStack_306) * uStack_2f6;
  uVar25 = (ushort)(uStack_2f4 < uStack_304) * uStack_304 |
           (ushort)(uStack_2f4 >= uStack_304) * uStack_2f4;
  uVar28 = (ushort)(uStack_2f2 < uStack_302) * uStack_302 |
           (ushort)(uStack_2f2 >= uStack_302) * uStack_2f2;
  uVar31 = (ushort)(uStack_2f0 < uStack_300) * uStack_300 |
           (ushort)(uStack_2f0 >= uStack_300) * uStack_2f0;
  uVar34 = (ushort)(uStack_2ee < uStack_2fe) * uStack_2fe |
           (ushort)(uStack_2ee >= uStack_2fe) * uStack_2ee;
  uVar37 = (ushort)(uStack_2ec < uStack_2fc) * uStack_2fc |
           (ushort)(uStack_2ec >= uStack_2fc) * uStack_2ec;
  uVar40 = (ushort)(uStack_2ea < uStack_2fa) * uStack_2fa |
           (ushort)(uStack_2ea >= uStack_2fa) * uStack_2ea;
  uVar18 = ((short)uVar18 < (short)uVar17) * uVar17 | ((short)uVar18 >= (short)uVar17) * uVar18;
  uVar23 = ((short)uVar23 < (short)uVar22) * uVar22 | ((short)uVar23 >= (short)uVar22) * uVar23;
  uVar26 = ((short)uVar26 < (short)uVar25) * uVar25 | ((short)uVar26 >= (short)uVar25) * uVar26;
  uVar29 = ((short)uVar29 < (short)uVar28) * uVar28 | ((short)uVar29 >= (short)uVar28) * uVar29;
  uVar32 = ((short)uVar32 < (short)uVar31) * uVar31 | ((short)uVar32 >= (short)uVar31) * uVar32;
  uVar35 = ((short)uVar35 < (short)uVar34) * uVar34 | ((short)uVar35 >= (short)uVar34) * uVar35;
  uVar38 = ((short)uVar38 < (short)uVar37) * uVar37 | ((short)uVar38 >= (short)uVar37) * uVar38;
  uVar41 = ((short)uVar41 < (short)uVar40) * uVar40 | ((short)uVar41 >= (short)uVar40) * uVar41;
  uVar16 = ((short)uVar17 < (short)uVar16) * uVar17 | ((short)uVar17 >= (short)uVar16) * uVar16;
  uVar21 = ((short)uVar22 < (short)uVar21) * uVar22 | ((short)uVar22 >= (short)uVar21) * uVar21;
  uVar24 = ((short)uVar25 < (short)uVar24) * uVar25 | ((short)uVar25 >= (short)uVar24) * uVar24;
  uVar27 = ((short)uVar28 < (short)uVar27) * uVar28 | ((short)uVar28 >= (short)uVar27) * uVar27;
  uVar30 = ((short)uVar31 < (short)uVar30) * uVar31 | ((short)uVar31 >= (short)uVar30) * uVar30;
  uVar33 = ((short)uVar34 < (short)uVar33) * uVar34 | ((short)uVar34 >= (short)uVar33) * uVar33;
  uVar36 = ((short)uVar37 < (short)uVar36) * uVar37 | ((short)uVar37 >= (short)uVar36) * uVar36;
  uVar39 = ((short)uVar40 < (short)uVar39) * uVar40 | ((short)uVar40 >= (short)uVar39) * uVar39;
  uVar1 = *(undefined8 *)((long)in_RDI + (long)(in_ESI * 6));
  local_998 = (byte)uVar1;
  uStack_997 = (undefined1)((ulong)uVar1 >> 8);
  uStack_996 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_995 = (undefined1)((ulong)uVar1 >> 0x18);
  uStack_994 = (byte)((ulong)uVar1 >> 0x20);
  uStack_993 = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_992 = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_991 = (undefined1)((ulong)uVar1 >> 0x38);
  uVar1 = *(undefined8 *)((long)in_RDX + (long)(in_ECX * 6));
  local_9b8 = (byte)uVar1;
  uStack_9b7 = (undefined1)((ulong)uVar1 >> 8);
  uStack_9b6 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_9b5 = (undefined1)((ulong)uVar1 >> 0x18);
  uStack_9b4 = (byte)((ulong)uVar1 >> 0x20);
  uStack_9b3 = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_9b2 = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_9b1 = (undefined1)((ulong)uVar1 >> 0x38);
  auVar3[1] = 0;
  auVar3[0] = local_998;
  auVar3[2] = uStack_997;
  auVar3[3] = 0;
  auVar3[4] = uStack_996;
  auVar3[5] = 0;
  auVar3[6] = uStack_995;
  auVar3[7] = 0;
  auVar3[9] = 0;
  auVar3[8] = uStack_994;
  auVar3[10] = uStack_993;
  auVar3[0xb] = 0;
  auVar3[0xc] = uStack_992;
  auVar3[0xd] = 0;
  auVar3[0xe] = uStack_991;
  auVar2[1] = 0;
  auVar2[0] = local_9b8;
  auVar2[2] = uStack_9b7;
  auVar2[3] = 0;
  auVar2[4] = uStack_9b6;
  auVar2[5] = 0;
  auVar2[6] = uStack_9b5;
  auVar2[7] = 0;
  auVar2[9] = 0;
  auVar2[8] = uStack_9b4;
  auVar2[10] = uStack_9b3;
  auVar2[0xb] = 0;
  auVar2[0xc] = uStack_9b2;
  auVar2[0xd] = 0;
  auVar2[0xe] = uStack_9b1;
  auVar3[0xf] = 0;
  auVar2[0xf] = 0;
  auVar19 = psubsw(auVar3,auVar2);
  auVar20 = psubsw(ZEXT816(0),auVar19);
  local_338 = auVar19._0_2_;
  uStack_336 = auVar19._2_2_;
  uStack_334 = auVar19._4_2_;
  uStack_332 = auVar19._6_2_;
  uStack_330 = auVar19._8_2_;
  uStack_32e = auVar19._10_2_;
  uStack_32c = auVar19._12_2_;
  uStack_32a = auVar19._14_2_;
  local_348 = auVar20._0_2_;
  uStack_346 = auVar20._2_2_;
  uStack_344 = auVar20._4_2_;
  uStack_342 = auVar20._6_2_;
  uStack_340 = auVar20._8_2_;
  uStack_33e = auVar20._10_2_;
  uStack_33c = auVar20._12_2_;
  uStack_33a = auVar20._14_2_;
  uVar17 = (ushort)(local_338 < local_348) * local_348 |
           (ushort)(local_338 >= local_348) * local_338;
  uVar22 = (ushort)(uStack_336 < uStack_346) * uStack_346 |
           (ushort)(uStack_336 >= uStack_346) * uStack_336;
  uVar25 = (ushort)(uStack_334 < uStack_344) * uStack_344 |
           (ushort)(uStack_334 >= uStack_344) * uStack_334;
  uVar28 = (ushort)(uStack_332 < uStack_342) * uStack_342 |
           (ushort)(uStack_332 >= uStack_342) * uStack_332;
  uVar31 = (ushort)(uStack_330 < uStack_340) * uStack_340 |
           (ushort)(uStack_330 >= uStack_340) * uStack_330;
  uVar34 = (ushort)(uStack_32e < uStack_33e) * uStack_33e |
           (ushort)(uStack_32e >= uStack_33e) * uStack_32e;
  uVar37 = (ushort)(uStack_32c < uStack_33c) * uStack_33c |
           (ushort)(uStack_32c >= uStack_33c) * uStack_32c;
  uVar40 = (ushort)(uStack_32a < uStack_33a) * uStack_33a |
           (ushort)(uStack_32a >= uStack_33a) * uStack_32a;
  uVar18 = ((short)uVar18 < (short)uVar17) * uVar17 | ((short)uVar18 >= (short)uVar17) * uVar18;
  uVar23 = ((short)uVar23 < (short)uVar22) * uVar22 | ((short)uVar23 >= (short)uVar22) * uVar23;
  uVar26 = ((short)uVar26 < (short)uVar25) * uVar25 | ((short)uVar26 >= (short)uVar25) * uVar26;
  uVar29 = ((short)uVar29 < (short)uVar28) * uVar28 | ((short)uVar29 >= (short)uVar28) * uVar29;
  uVar32 = ((short)uVar32 < (short)uVar31) * uVar31 | ((short)uVar32 >= (short)uVar31) * uVar32;
  uVar35 = ((short)uVar35 < (short)uVar34) * uVar34 | ((short)uVar35 >= (short)uVar34) * uVar35;
  uVar38 = ((short)uVar38 < (short)uVar37) * uVar37 | ((short)uVar38 >= (short)uVar37) * uVar38;
  uVar41 = ((short)uVar41 < (short)uVar40) * uVar40 | ((short)uVar41 >= (short)uVar40) * uVar41;
  uVar16 = ((short)uVar17 < (short)uVar16) * uVar17 | ((short)uVar17 >= (short)uVar16) * uVar16;
  uVar21 = ((short)uVar22 < (short)uVar21) * uVar22 | ((short)uVar22 >= (short)uVar21) * uVar21;
  uVar24 = ((short)uVar25 < (short)uVar24) * uVar25 | ((short)uVar25 >= (short)uVar24) * uVar24;
  uVar27 = ((short)uVar28 < (short)uVar27) * uVar28 | ((short)uVar28 >= (short)uVar27) * uVar27;
  uVar30 = ((short)uVar31 < (short)uVar30) * uVar31 | ((short)uVar31 >= (short)uVar30) * uVar30;
  uVar33 = ((short)uVar34 < (short)uVar33) * uVar34 | ((short)uVar34 >= (short)uVar33) * uVar33;
  uVar36 = ((short)uVar37 < (short)uVar36) * uVar37 | ((short)uVar37 >= (short)uVar36) * uVar36;
  uVar39 = ((short)uVar40 < (short)uVar39) * uVar40 | ((short)uVar40 >= (short)uVar39) * uVar39;
  uVar1 = *(undefined8 *)((long)in_RDI + (long)(in_ESI * 7));
  local_9d8 = (byte)uVar1;
  uStack_9d7 = (undefined1)((ulong)uVar1 >> 8);
  uStack_9d6 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_9d5 = (undefined1)((ulong)uVar1 >> 0x18);
  uStack_9d4 = (byte)((ulong)uVar1 >> 0x20);
  uStack_9d3 = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_9d2 = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_9d1 = (undefined1)((ulong)uVar1 >> 0x38);
  uVar1 = *(undefined8 *)((long)in_RDX + (long)(in_ECX * 7));
  local_9f8 = (byte)uVar1;
  uStack_9f7 = (undefined1)((ulong)uVar1 >> 8);
  uStack_9f6 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_9f5 = (undefined1)((ulong)uVar1 >> 0x18);
  uStack_9f4 = (byte)((ulong)uVar1 >> 0x20);
  uStack_9f3 = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_9f2 = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_9f1 = (undefined1)((ulong)uVar1 >> 0x38);
  auVar20[1] = 0;
  auVar20[0] = local_9d8;
  auVar20[2] = uStack_9d7;
  auVar20[3] = 0;
  auVar20[4] = uStack_9d6;
  auVar20[5] = 0;
  auVar20[6] = uStack_9d5;
  auVar20[7] = 0;
  auVar20[9] = 0;
  auVar20[8] = uStack_9d4;
  auVar20[10] = uStack_9d3;
  auVar20[0xb] = 0;
  auVar20[0xc] = uStack_9d2;
  auVar20[0xd] = 0;
  auVar20[0xe] = uStack_9d1;
  auVar19[1] = 0;
  auVar19[0] = local_9f8;
  auVar19[2] = uStack_9f7;
  auVar19[3] = 0;
  auVar19[4] = uStack_9f6;
  auVar19[5] = 0;
  auVar19[6] = uStack_9f5;
  auVar19[7] = 0;
  auVar19[9] = 0;
  auVar19[8] = uStack_9f4;
  auVar19[10] = uStack_9f3;
  auVar19[0xb] = 0;
  auVar19[0xc] = uStack_9f2;
  auVar19[0xd] = 0;
  auVar19[0xe] = uStack_9f1;
  auVar20[0xf] = 0;
  auVar19[0xf] = 0;
  auVar19 = psubsw(auVar20,auVar19);
  auVar20 = psubsw(ZEXT816(0),auVar19);
  local_378 = auVar19._0_2_;
  uStack_376 = auVar19._2_2_;
  uStack_374 = auVar19._4_2_;
  uStack_372 = auVar19._6_2_;
  uStack_370 = auVar19._8_2_;
  uStack_36e = auVar19._10_2_;
  uStack_36c = auVar19._12_2_;
  uStack_36a = auVar19._14_2_;
  local_388 = auVar20._0_2_;
  uStack_386 = auVar20._2_2_;
  uStack_384 = auVar20._4_2_;
  uStack_382 = auVar20._6_2_;
  uStack_380 = auVar20._8_2_;
  uStack_37e = auVar20._10_2_;
  uStack_37c = auVar20._12_2_;
  uStack_37a = auVar20._14_2_;
  uVar17 = (ushort)(local_378 < local_388) * local_388 |
           (ushort)(local_378 >= local_388) * local_378;
  uVar22 = (ushort)(uStack_376 < uStack_386) * uStack_386 |
           (ushort)(uStack_376 >= uStack_386) * uStack_376;
  uVar25 = (ushort)(uStack_374 < uStack_384) * uStack_384 |
           (ushort)(uStack_374 >= uStack_384) * uStack_374;
  uVar28 = (ushort)(uStack_372 < uStack_382) * uStack_382 |
           (ushort)(uStack_372 >= uStack_382) * uStack_372;
  uVar31 = (ushort)(uStack_370 < uStack_380) * uStack_380 |
           (ushort)(uStack_370 >= uStack_380) * uStack_370;
  uVar34 = (ushort)(uStack_36e < uStack_37e) * uStack_37e |
           (ushort)(uStack_36e >= uStack_37e) * uStack_36e;
  uVar37 = (ushort)(uStack_36c < uStack_37c) * uStack_37c |
           (ushort)(uStack_36c >= uStack_37c) * uStack_36c;
  uVar40 = (ushort)(uStack_36a < uStack_37a) * uStack_37a |
           (ushort)(uStack_36a >= uStack_37a) * uStack_36a;
  uVar18 = ((short)uVar18 < (short)uVar17) * uVar17 | ((short)uVar18 >= (short)uVar17) * uVar18;
  uVar23 = ((short)uVar23 < (short)uVar22) * uVar22 | ((short)uVar23 >= (short)uVar22) * uVar23;
  uVar26 = ((short)uVar26 < (short)uVar25) * uVar25 | ((short)uVar26 >= (short)uVar25) * uVar26;
  uVar29 = ((short)uVar29 < (short)uVar28) * uVar28 | ((short)uVar29 >= (short)uVar28) * uVar29;
  uVar32 = ((short)uVar32 < (short)uVar31) * uVar31 | ((short)uVar32 >= (short)uVar31) * uVar32;
  uVar35 = ((short)uVar35 < (short)uVar34) * uVar34 | ((short)uVar35 >= (short)uVar34) * uVar35;
  uVar38 = ((short)uVar38 < (short)uVar37) * uVar37 | ((short)uVar38 >= (short)uVar37) * uVar38;
  uVar41 = ((short)uVar41 < (short)uVar40) * uVar40 | ((short)uVar41 >= (short)uVar40) * uVar41;
  uVar16 = ((short)uVar17 < (short)uVar16) * uVar17 | ((short)uVar17 >= (short)uVar16) * uVar16;
  uVar21 = ((short)uVar22 < (short)uVar21) * uVar22 | ((short)uVar22 >= (short)uVar21) * uVar21;
  uVar22 = ((short)uVar25 < (short)uVar24) * uVar25 | ((short)uVar25 >= (short)uVar24) * uVar24;
  uVar24 = ((short)uVar28 < (short)uVar27) * uVar28 | ((short)uVar28 >= (short)uVar27) * uVar27;
  uVar27 = ((short)uVar31 < (short)uVar30) * uVar31 | ((short)uVar31 >= (short)uVar30) * uVar30;
  uVar28 = ((short)uVar34 < (short)uVar33) * uVar34 | ((short)uVar34 >= (short)uVar33) * uVar33;
  uVar30 = ((short)uVar37 < (short)uVar36) * uVar37 | ((short)uVar37 >= (short)uVar36) * uVar36;
  uVar31 = ((short)uVar40 < (short)uVar39) * uVar40 | ((short)uVar40 >= (short)uVar39) * uVar39;
  uVar17 = ((short)uVar18 < (short)uVar32) * uVar32 | ((short)uVar18 >= (short)uVar32) * uVar18;
  uVar18 = ((short)uVar23 < (short)uVar35) * uVar35 | ((short)uVar23 >= (short)uVar35) * uVar23;
  uVar23 = ((short)uVar26 < (short)uVar38) * uVar38 | ((short)uVar26 >= (short)uVar38) * uVar26;
  uVar25 = ((short)uVar29 < (short)uVar41) * uVar41 | ((short)uVar29 >= (short)uVar41) * uVar29;
  uVar17 = ((short)uVar17 < (short)uVar23) * uVar23 | ((short)uVar17 >= (short)uVar23) * uVar17;
  uVar18 = ((short)uVar18 < (short)uVar25) * uVar25 | ((short)uVar18 >= (short)uVar25) * uVar18;
  *in_R9 = (uint)(ushort)(((short)uVar17 < (short)uVar18) * uVar18 |
                         ((short)uVar17 >= (short)uVar18) * uVar17);
  uVar16 = ((short)uVar27 < (short)uVar16) * uVar27 | ((short)uVar27 >= (short)uVar16) * uVar16;
  uVar17 = ((short)uVar28 < (short)uVar21) * uVar28 | ((short)uVar28 >= (short)uVar21) * uVar21;
  uVar18 = ((short)uVar30 < (short)uVar22) * uVar30 | ((short)uVar30 >= (short)uVar22) * uVar22;
  uVar21 = ((short)uVar31 < (short)uVar24) * uVar31 | ((short)uVar31 >= (short)uVar24) * uVar24;
  uVar16 = ((short)uVar18 < (short)uVar16) * uVar18 | ((short)uVar18 >= (short)uVar16) * uVar16;
  uVar17 = ((short)uVar21 < (short)uVar17) * uVar21 | ((short)uVar21 >= (short)uVar17) * uVar17;
  *in_R8 = (uint)(ushort)(((short)uVar17 < (short)uVar16) * uVar17 |
                         ((short)uVar17 >= (short)uVar16) * uVar16);
  return;
}

Assistant:

void aom_minmax_8x8_sse2(const uint8_t *s, int p, const uint8_t *d, int dp,
                         int *min, int *max) {
  __m128i u0, s0, d0, diff, maxabsdiff, minabsdiff, negdiff, absdiff0, absdiff;
  u0 = _mm_setzero_si128();
  // Row 0
  s0 = _mm_unpacklo_epi8(_mm_loadl_epi64((const __m128i *)(s)), u0);
  d0 = _mm_unpacklo_epi8(_mm_loadl_epi64((const __m128i *)(d)), u0);
  diff = _mm_subs_epi16(s0, d0);
  negdiff = _mm_subs_epi16(u0, diff);
  absdiff0 = _mm_max_epi16(diff, negdiff);
  // Row 1
  s0 = _mm_unpacklo_epi8(_mm_loadl_epi64((const __m128i *)(s + p)), u0);
  d0 = _mm_unpacklo_epi8(_mm_loadl_epi64((const __m128i *)(d + dp)), u0);
  diff = _mm_subs_epi16(s0, d0);
  negdiff = _mm_subs_epi16(u0, diff);
  absdiff = _mm_max_epi16(diff, negdiff);
  maxabsdiff = _mm_max_epi16(absdiff0, absdiff);
  minabsdiff = _mm_min_epi16(absdiff0, absdiff);
  // Row 2
  s0 = _mm_unpacklo_epi8(_mm_loadl_epi64((const __m128i *)(s + 2 * p)), u0);
  d0 = _mm_unpacklo_epi8(_mm_loadl_epi64((const __m128i *)(d + 2 * dp)), u0);
  diff = _mm_subs_epi16(s0, d0);
  negdiff = _mm_subs_epi16(u0, diff);
  absdiff = _mm_max_epi16(diff, negdiff);
  maxabsdiff = _mm_max_epi16(maxabsdiff, absdiff);
  minabsdiff = _mm_min_epi16(minabsdiff, absdiff);
  // Row 3
  s0 = _mm_unpacklo_epi8(_mm_loadl_epi64((const __m128i *)(s + 3 * p)), u0);
  d0 = _mm_unpacklo_epi8(_mm_loadl_epi64((const __m128i *)(d + 3 * dp)), u0);
  diff = _mm_subs_epi16(s0, d0);
  negdiff = _mm_subs_epi16(u0, diff);
  absdiff = _mm_max_epi16(diff, negdiff);
  maxabsdiff = _mm_max_epi16(maxabsdiff, absdiff);
  minabsdiff = _mm_min_epi16(minabsdiff, absdiff);
  // Row 4
  s0 = _mm_unpacklo_epi8(_mm_loadl_epi64((const __m128i *)(s + 4 * p)), u0);
  d0 = _mm_unpacklo_epi8(_mm_loadl_epi64((const __m128i *)(d + 4 * dp)), u0);
  diff = _mm_subs_epi16(s0, d0);
  negdiff = _mm_subs_epi16(u0, diff);
  absdiff = _mm_max_epi16(diff, negdiff);
  maxabsdiff = _mm_max_epi16(maxabsdiff, absdiff);
  minabsdiff = _mm_min_epi16(minabsdiff, absdiff);
  // Row 5
  s0 = _mm_unpacklo_epi8(_mm_loadl_epi64((const __m128i *)(s + 5 * p)), u0);
  d0 = _mm_unpacklo_epi8(_mm_loadl_epi64((const __m128i *)(d + 5 * dp)), u0);
  diff = _mm_subs_epi16(s0, d0);
  negdiff = _mm_subs_epi16(u0, diff);
  absdiff = _mm_max_epi16(diff, negdiff);
  maxabsdiff = _mm_max_epi16(maxabsdiff, absdiff);
  minabsdiff = _mm_min_epi16(minabsdiff, absdiff);
  // Row 6
  s0 = _mm_unpacklo_epi8(_mm_loadl_epi64((const __m128i *)(s + 6 * p)), u0);
  d0 = _mm_unpacklo_epi8(_mm_loadl_epi64((const __m128i *)(d + 6 * dp)), u0);
  diff = _mm_subs_epi16(s0, d0);
  negdiff = _mm_subs_epi16(u0, diff);
  absdiff = _mm_max_epi16(diff, negdiff);
  maxabsdiff = _mm_max_epi16(maxabsdiff, absdiff);
  minabsdiff = _mm_min_epi16(minabsdiff, absdiff);
  // Row 7
  s0 = _mm_unpacklo_epi8(_mm_loadl_epi64((const __m128i *)(s + 7 * p)), u0);
  d0 = _mm_unpacklo_epi8(_mm_loadl_epi64((const __m128i *)(d + 7 * dp)), u0);
  diff = _mm_subs_epi16(s0, d0);
  negdiff = _mm_subs_epi16(u0, diff);
  absdiff = _mm_max_epi16(diff, negdiff);
  maxabsdiff = _mm_max_epi16(maxabsdiff, absdiff);
  minabsdiff = _mm_min_epi16(minabsdiff, absdiff);

  maxabsdiff = _mm_max_epi16(maxabsdiff, _mm_srli_si128(maxabsdiff, 8));
  maxabsdiff = _mm_max_epi16(maxabsdiff, _mm_srli_epi64(maxabsdiff, 32));
  maxabsdiff = _mm_max_epi16(maxabsdiff, _mm_srli_epi64(maxabsdiff, 16));
  *max = _mm_extract_epi16(maxabsdiff, 0);

  minabsdiff = _mm_min_epi16(minabsdiff, _mm_srli_si128(minabsdiff, 8));
  minabsdiff = _mm_min_epi16(minabsdiff, _mm_srli_epi64(minabsdiff, 32));
  minabsdiff = _mm_min_epi16(minabsdiff, _mm_srli_epi64(minabsdiff, 16));
  *min = _mm_extract_epi16(minabsdiff, 0);
}